

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O3

ssize_t Transform::read(int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  undefined4 in_register_0000003c;
  uint8_t *puVar3;
  
  iVar1 = Util::readFloat32((uint8_t *)CONCAT44(in_register_0000003c,__fd),(float *)__buf);
  puVar3 = (uint8_t *)CONCAT44(in_register_0000003c,__fd) + iVar1;
  iVar1 = Util::readFloat32(puVar3,(float *)((long)__buf + 4));
  puVar3 = puVar3 + iVar1;
  iVar1 = Util::readFloat32(puVar3,(float *)((long)__buf + 8));
  puVar3 = puVar3 + iVar1;
  iVar1 = Util::readFloat32(puVar3,(float *)((long)__buf + 0xc));
  puVar3 = puVar3 + iVar1;
  iVar1 = Util::readFloat32(puVar3,(float *)((long)__buf + 0x10));
  puVar3 = puVar3 + iVar1;
  iVar1 = Util::readFloat32(puVar3,(float *)((long)__buf + 0x14));
  puVar3 = puVar3 + iVar1;
  iVar1 = Util::readFloat32(puVar3,(float *)((long)__buf + 0x18));
  iVar2 = Util::readFloat32(puVar3 + iVar1,(float *)((long)__buf + 0x1c));
  Util::readFloat32(puVar3 + iVar1 + iVar2,(float *)((long)__buf + 0x20));
  return 0x24;
}

Assistant:

int Transform::read(uint8_t* buf, Transform &out)
{
	buf += Util::readFloat32(buf, out.transX);
	buf += Util::readFloat32(buf, out.transY);
	buf += Util::readFloat32(buf, out.transZ);

	buf += Util::readFloat32(buf, out.scaleX);
	buf += Util::readFloat32(buf, out.scaleY);
	buf += Util::readFloat32(buf, out.scaleZ);

	buf += Util::readFloat32(buf, out.angleX);
	buf += Util::readFloat32(buf, out.angleY);
	buf += Util::readFloat32(buf, out.angleZ);

	return sizeof(out.transX) * 9;
}